

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_set_bit_size_expression(coda_type *type,coda_expression *bit_size_expr)

{
  coda_expression *bit_size_expr_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x36d);
    type_local._4_4_ = -1;
  }
  else if (bit_size_expr == (coda_expression *)0x0) {
    coda_set_error(-100,"bit_size_expr argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x372);
    type_local._4_4_ = -1;
  }
  else if (type->size_expr == (coda_expression *)0x0) {
    if ((type->type_class == coda_record_class) || (type->type_class == coda_array_class)) {
      if (0 < type->bit_size) {
        coda_set_error(-400,"type already has a bit size");
        return -1;
      }
    }
    else if (-1 < type->bit_size) {
      coda_set_error(-400,"type already has a bit size");
      return -1;
    }
    type->size_expr = bit_size_expr;
    type->bit_size = -1;
    type_local._4_4_ = 0;
  }
  else {
    coda_set_error(-400,"type already has a bit size expression");
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_type_set_bit_size_expression(coda_type *type, coda_expression *bit_size_expr)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (bit_size_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_size_expr argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->size_expr != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a bit size expression");
        return -1;
    }
    if (type->type_class == coda_record_class || type->type_class == coda_array_class)
    {
        /* for compound types we also allow setting a bit size expression if the bit_size is currently 0 */
        if (type->bit_size > 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a bit size");
            return -1;
        }
    }
    else
    {
        if (type->bit_size >= 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a bit size");
            return -1;
        }
    }
    type->size_expr = bit_size_expr;
    type->bit_size = -1;
    return 0;
}